

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

int drmp3_hdr_frame_bytes(drmp3_uint8 *h,int free_format_size)

{
  uint uVar1;
  uint uVar2;
  uint in_ESI;
  drmp3_uint8 *in_RDI;
  int frame_bytes;
  uint local_1c;
  uint local_10;
  
  uVar1 = drmp3_hdr_frame_samples(in_RDI);
  uVar2 = drmp3_hdr_bitrate_kbps(in_RDI);
  local_10 = drmp3_hdr_sample_rate_hz(in_RDI);
  local_10 = (uVar1 * uVar2 * 0x7d) / local_10;
  if ((in_RDI[1] & 6) == 6) {
    local_10 = local_10 & 0xfffffffc;
  }
  local_1c = in_ESI;
  if (local_10 != 0) {
    local_1c = local_10;
  }
  return local_1c;
}

Assistant:

static int drmp3_hdr_frame_bytes(const drmp3_uint8 *h, int free_format_size)
{
    int frame_bytes = drmp3_hdr_frame_samples(h)*drmp3_hdr_bitrate_kbps(h)*125/drmp3_hdr_sample_rate_hz(h);
    if (DRMP3_HDR_IS_LAYER_1(h))
    {
        frame_bytes &= ~3; /* slot align */
    }
    return frame_bytes ? frame_bytes : free_format_size;
}